

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O3

int VP8RecordCoeffTokens(int ctx,VP8Residual *res,VP8TBuffer *tokens)

{
  long lVar1;
  byte bVar2;
  ushort uVar3;
  int16_t *piVar4;
  StatsArray *paapVar5;
  bool bVar6;
  short sVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint8_t *puVar16;
  proba_t (*papVar17) [11];
  uint16_t uVar18;
  int iVar19;
  ushort uVar20;
  ulong uVar21;
  long lVar22;
  
  piVar4 = res->coeffs;
  iVar9 = res->coeff_type;
  uVar12 = res->last;
  uVar21 = (ulong)uVar12;
  iVar10 = res->first;
  iVar19 = ((iVar10 + iVar9 * 8) * 3 + ctx) * 0xb;
  papVar17 = res->stats[iVar10] + ctx;
  iVar8 = tokens->left_;
  if (iVar8 < 1) {
    iVar8 = TBufferNewPage(tokens);
    if (iVar8 == 0) goto LAB_0013ac0c;
    iVar8 = tokens->left_;
  }
  tokens->left_ = iVar8 + -1;
  tokens->tokens_[(long)iVar8 + -1] = ~(ushort)(uVar12 >> 0x10) & 0x8000 | (ushort)iVar19;
LAB_0013ac0c:
  uVar13 = (*papVar17)[0];
  uVar14 = uVar13 + 1 >> 1 & 0x7fff7fff;
  if (uVar13 < 0xfffe0000) {
    uVar14 = uVar13;
  }
  (*papVar17)[0] = (uVar12 >> 0x1f ^ 0x10001) + uVar14;
  if ((int)uVar12 < 0) {
    iVar8 = 0;
  }
  else {
    iVar8 = 1;
    if (iVar10 < 0x10) {
      iVar9 = iVar9 * 8;
      lVar15 = (long)iVar10;
      do {
        uVar3 = piVar4[lVar15];
        uVar20 = -uVar3;
        if (0 < (short)uVar3) {
          uVar20 = uVar3;
        }
        iVar10 = tokens->left_;
        sVar7 = (short)iVar19;
        if (iVar10 < 1) {
          iVar10 = TBufferNewPage(tokens);
          if (iVar10 != 0) {
            iVar10 = tokens->left_;
            goto LAB_0013ac95;
          }
        }
        else {
LAB_0013ac95:
          tokens->left_ = iVar10 + -1;
          tokens->tokens_[(long)iVar10 + -1] = (ushort)(uVar3 != 0) << 0xf | sVar7 + 1U;
        }
        lVar1 = lVar15 + 1;
        uVar12 = (*papVar17)[1];
        uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
        if (uVar12 < 0xfffe0000) {
          uVar13 = uVar12;
        }
        (*papVar17)[1] = (uVar3 == 0 ^ 0x10001) + uVar13;
        if (uVar3 == 0) {
          bVar2 = ""[lVar15 + 1];
          iVar19 = (iVar9 + (uint)bVar2) * 0x21;
          papVar17 = (proba_t (*) [11])((long)*res->stats + (ulong)bVar2 * 0x80 + (ulong)bVar2 * 4);
        }
        else {
          iVar10 = tokens->left_;
          if (iVar10 < 1) {
            iVar10 = TBufferNewPage(tokens);
            if (iVar10 != 0) {
              iVar10 = tokens->left_;
              goto LAB_0013ad0e;
            }
          }
          else {
LAB_0013ad0e:
            tokens->left_ = iVar10 + -1;
            tokens->tokens_[(long)iVar10 + -1] = (ushort)(1 < uVar20) << 0xf | sVar7 + 2U;
          }
          uVar12 = (*papVar17)[2];
          uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
          if (uVar12 < 0xfffe0000) {
            uVar13 = uVar12;
          }
          (*papVar17)[2] = (0x10001 - (uint)(uVar20 < 2)) + uVar13;
          if (uVar20 < 2) {
            lVar22 = 1;
            iVar19 = 0xb;
          }
          else {
            iVar10 = tokens->left_;
            if (iVar10 < 1) {
              iVar10 = TBufferNewPage(tokens);
              if (iVar10 != 0) {
                iVar10 = tokens->left_;
                goto LAB_0013aec5;
              }
            }
            else {
LAB_0013aec5:
              tokens->left_ = iVar10 + -1;
              tokens->tokens_[(long)iVar10 + -1] = (ushort)(4 < uVar20) << 0xf | sVar7 + 3U;
            }
            uVar12 = (*papVar17)[3];
            uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
            if (uVar12 < 0xfffe0000) {
              uVar13 = uVar12;
            }
            (*papVar17)[3] = (0x10001 - (uint)(uVar20 < 5)) + uVar13;
            iVar10 = tokens->left_;
            if (uVar20 < 5) {
              if (iVar10 < 1) {
                iVar10 = TBufferNewPage(tokens);
                if (iVar10 != 0) {
                  iVar10 = tokens->left_;
                  goto LAB_0013af42;
                }
              }
              else {
LAB_0013af42:
                tokens->left_ = iVar10 + -1;
                tokens->tokens_[(long)iVar10 + -1] = (ushort)(uVar20 != 2) << 0xf | sVar7 + 4U;
              }
              uVar12 = (*papVar17)[4];
              uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
              if (uVar12 < 0xfffe0000) {
                uVar13 = uVar12;
              }
              (*papVar17)[4] = (uVar20 == 2 ^ 0x10001) + uVar13;
              lVar22 = 2;
              iVar19 = 0x16;
              if (uVar20 == 2) goto LAB_0013ad7c;
              iVar10 = tokens->left_;
              if (iVar10 < 1) {
                iVar10 = TBufferNewPage(tokens);
                if (iVar10 != 0) {
                  iVar10 = tokens->left_;
                  goto LAB_0013afcb;
                }
              }
              else {
LAB_0013afcb:
                tokens->left_ = iVar10 + -1;
                tokens->tokens_[(long)iVar10 + -1] = (ushort)(uVar20 == 4) << 0xf | sVar7 + 5U;
              }
              uVar12 = (*papVar17)[5];
              uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
              if (uVar12 < 0xfffe0000) {
                uVar13 = uVar12;
              }
              (*papVar17)[5] = (uVar20 == 4) + uVar13 + 0x10000;
            }
            else {
              if (iVar10 < 1) {
                iVar10 = TBufferNewPage(tokens);
                if (iVar10 != 0) {
                  iVar10 = tokens->left_;
                  goto LAB_0013b042;
                }
              }
              else {
LAB_0013b042:
                tokens->left_ = iVar10 + -1;
                tokens->tokens_[(long)iVar10 + -1] = (ushort)(10 < uVar20) << 0xf | sVar7 + 6U;
              }
              uVar12 = (*papVar17)[6];
              uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
              if (uVar12 < 0xfffe0000) {
                uVar13 = uVar12;
              }
              (*papVar17)[6] = (0x10001 - (uint)(uVar20 < 0xb)) + uVar13;
              if (uVar20 < 0xb) {
                iVar10 = tokens->left_;
                if (iVar10 < 1) {
                  iVar10 = TBufferNewPage(tokens);
                  if (iVar10 != 0) {
                    iVar10 = tokens->left_;
                    goto LAB_0013b0c0;
                  }
                }
                else {
LAB_0013b0c0:
                  tokens->left_ = iVar10 + -1;
                  tokens->tokens_[(long)iVar10 + -1] = (ushort)(6 < uVar20) << 0xf | sVar7 + 7U;
                }
                uVar12 = (*papVar17)[7];
                uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
                if (uVar12 < 0xfffe0000) {
                  uVar13 = uVar12;
                }
                (*papVar17)[7] = (0x10001 - (uint)(uVar20 < 7)) + uVar13;
                iVar10 = tokens->left_;
                if (uVar20 < 7) {
                  if (iVar10 < 1) {
                    iVar10 = TBufferNewPage(tokens);
                    if (iVar10 == 0) {
LAB_0013b416:
                      lVar22 = 2;
                      iVar19 = 0x16;
                      goto LAB_0013ad7c;
                    }
                    iVar10 = tokens->left_;
                  }
                  tokens->left_ = iVar10 + -1;
                  tokens->tokens_[(long)iVar10 + -1] = (ushort)(uVar20 != 6) * -0x8000 + 0xc09f;
                }
                else {
                  if (iVar10 < 1) {
                    iVar8 = TBufferNewPage(tokens);
                    iVar10 = tokens->left_;
                    if (iVar8 != 0) goto LAB_0013b237;
                  }
                  else {
LAB_0013b237:
                    lVar22 = (long)iVar10;
                    iVar10 = iVar10 + -1;
                    tokens->left_ = iVar10;
                    tokens->tokens_[lVar22 + -1] = (ushort)(uVar20 < 9) * -0x8000 + 0xc0a5;
                  }
                  if (iVar10 < 1) {
                    iVar10 = TBufferNewPage(tokens);
                    if (iVar10 == 0) goto LAB_0013b416;
                    iVar10 = tokens->left_;
                  }
                  tokens->left_ = iVar10 + -1;
                  tokens->tokens_[(long)iVar10 + -1] = uVar20 << 0xf ^ 0xc091;
                }
                lVar22 = 2;
                iVar19 = 0x16;
              }
              else {
                uVar12 = uVar20 - 3;
                if (uVar12 < 0x10) {
                  iVar10 = tokens->left_;
                  if (iVar10 < 1) {
                    iVar10 = TBufferNewPage(tokens);
                    if (iVar10 != 0) {
                      iVar10 = tokens->left_;
                      goto LAB_0013b193;
                    }
                  }
                  else {
LAB_0013b193:
                    tokens->left_ = iVar10 + -1;
                    tokens->tokens_[(long)iVar10 + -1] = sVar7 + 8;
                  }
                  uVar12 = (*papVar17)[8];
                  uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
                  if (uVar12 < 0xfffe0000) {
                    uVar13 = uVar12;
                  }
                  (*papVar17)[8] = uVar13 + 0x10000;
                  iVar10 = tokens->left_;
                  if (0 < iVar10) {
LAB_0013b1f5:
                    iVar10 = iVar10 + -1;
                    tokens->left_ = iVar10;
                    uVar18 = sVar7 + 9;
                    uVar12 = 4;
                    iVar19 = -0xb;
                    iVar8 = 0x10000;
                    puVar16 = VP8Cat3;
                    goto LAB_0013b4db;
                  }
                  iVar10 = TBufferNewPage(tokens);
                  if (iVar10 != 0) {
                    iVar10 = tokens->left_;
                    goto LAB_0013b1f5;
                  }
                  uVar12 = 4;
                  iVar19 = -0xb;
                  iVar8 = 0x10000;
                  puVar16 = VP8Cat3;
                }
                else {
                  if (uVar12 < 0x20) {
                    iVar10 = tokens->left_;
                    if (iVar10 < 1) {
                      iVar10 = TBufferNewPage(tokens);
                      if (iVar10 != 0) {
                        iVar10 = tokens->left_;
                        goto LAB_0013b2d2;
                      }
                    }
                    else {
LAB_0013b2d2:
                      tokens->left_ = iVar10 + -1;
                      tokens->tokens_[(long)iVar10 + -1] = sVar7 + 8;
                    }
                    uVar12 = (*papVar17)[8];
                    uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
                    if (uVar12 < 0xfffe0000) {
                      uVar13 = uVar12;
                    }
                    (*papVar17)[8] = uVar13 + 0x10000;
                    iVar10 = tokens->left_;
                    if (iVar10 < 1) {
                      iVar10 = TBufferNewPage(tokens);
                      if (iVar10 != 0) {
                        iVar10 = tokens->left_;
                        goto LAB_0013b334;
                      }
                      uVar12 = 8;
                      iVar19 = -0x13;
                      iVar8 = 0x10001;
                      puVar16 = VP8Cat4;
                      goto LAB_0013b4e6;
                    }
LAB_0013b334:
                    iVar10 = iVar10 + -1;
                    tokens->left_ = iVar10;
                    uVar18 = sVar7 + 9U | 0x8000;
                    uVar12 = 8;
                    iVar19 = -0x13;
                    iVar8 = 0x10001;
                    puVar16 = VP8Cat4;
                  }
                  else {
                    iVar10 = tokens->left_;
                    if (uVar12 < 0x40) {
                      if (iVar10 < 1) {
                        iVar10 = TBufferNewPage(tokens);
                        if (iVar10 != 0) {
                          iVar10 = tokens->left_;
                          goto LAB_0013b389;
                        }
                      }
                      else {
LAB_0013b389:
                        tokens->left_ = iVar10 + -1;
                        tokens->tokens_[(long)iVar10 + -1] = sVar7 + 8U | 0x8000;
                      }
                      uVar12 = (*papVar17)[8];
                      uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
                      if (uVar12 < 0xfffe0000) {
                        uVar13 = uVar12;
                      }
                      (*papVar17)[8] = uVar13 + 0x10001;
                      iVar10 = tokens->left_;
                      if (iVar10 < 1) {
                        iVar10 = TBufferNewPage(tokens);
                        if (iVar10 == 0) {
                          uVar12 = 0x10;
                          iVar19 = -0x23;
                          iVar8 = 0x10000;
                          puVar16 = VP8Cat5;
                          goto LAB_0013b4e6;
                        }
                        iVar10 = tokens->left_;
                      }
                      iVar10 = iVar10 + -1;
                      tokens->left_ = iVar10;
                      uVar18 = sVar7 + 10;
                      uVar12 = 0x10;
                      iVar19 = -0x23;
                      iVar8 = 0x10000;
                      puVar16 = VP8Cat5;
                    }
                    else {
                      if (iVar10 < 1) {
                        iVar10 = TBufferNewPage(tokens);
                        if (iVar10 != 0) {
                          iVar10 = tokens->left_;
                          goto LAB_0013b44c;
                        }
                      }
                      else {
LAB_0013b44c:
                        tokens->left_ = iVar10 + -1;
                        tokens->tokens_[(long)iVar10 + -1] = sVar7 + 8U | 0x8000;
                      }
                      uVar12 = (*papVar17)[8];
                      uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
                      if (uVar12 < 0xfffe0000) {
                        uVar13 = uVar12;
                      }
                      (*papVar17)[8] = uVar13 + 0x10001;
                      iVar10 = tokens->left_;
                      if (iVar10 < 1) {
                        iVar10 = TBufferNewPage(tokens);
                        if (iVar10 != 0) {
                          iVar10 = tokens->left_;
                          goto LAB_0013b4b4;
                        }
                        uVar12 = 0x400;
                        iVar19 = -0x43;
                        iVar8 = 0x10001;
                        puVar16 = VP8Cat6;
                        goto LAB_0013b4e6;
                      }
LAB_0013b4b4:
                      iVar10 = iVar10 + -1;
                      tokens->left_ = iVar10;
                      uVar18 = sVar7 + 10U | 0x8000;
                      uVar12 = 0x400;
                      iVar19 = -0x43;
                      iVar8 = 0x10001;
                      puVar16 = VP8Cat6;
                    }
                  }
LAB_0013b4db:
                  tokens->tokens_[iVar10] = uVar18;
                }
LAB_0013b4e6:
                uVar13 = (*papVar17)[9];
                uVar14 = uVar13 + 1 >> 1 & 0x7fff7fff;
                if (uVar13 < 0xfffe0000) {
                  uVar14 = uVar13;
                }
                (*papVar17)[9] = uVar14 + iVar8;
                do {
                  bVar2 = *puVar16;
                  iVar10 = tokens->left_;
                  if (iVar10 < 1) {
                    iVar10 = TBufferNewPage(tokens);
                    if (iVar10 != 0) {
                      iVar10 = tokens->left_;
                      goto LAB_0013b52b;
                    }
                  }
                  else {
LAB_0013b52b:
                    tokens->left_ = iVar10 + -1;
                    uVar11 = 0xc000;
                    if ((uVar12 & iVar19 + (uint)uVar20) == 0) {
                      uVar11 = 0x4000;
                    }
                    tokens->tokens_[(long)iVar10 + -1] = bVar2 | uVar11;
                  }
                  puVar16 = puVar16 + 1;
                  bVar6 = 1 < uVar12;
                  uVar12 = uVar12 >> 1;
                } while (bVar6);
                lVar22 = 2;
                iVar19 = 0x16;
              }
            }
          }
LAB_0013ad7c:
          bVar2 = ""[lVar15 + 1];
          paapVar5 = res->stats;
          iVar10 = tokens->left_;
          if (iVar10 < 1) {
            iVar10 = TBufferNewPage(tokens);
            if (iVar10 != 0) {
              iVar10 = tokens->left_;
              goto LAB_0013adb6;
            }
          }
          else {
LAB_0013adb6:
            tokens->left_ = iVar10 + -1;
            tokens->tokens_[(long)iVar10 + -1] = uVar3 & 0x8000 | 0x4080;
          }
          if (lVar1 == 0x10) break;
          iVar19 = ((uint)bVar2 + iVar9) * 0x21 + iVar19;
          iVar10 = tokens->left_;
          if (iVar10 < 1) {
            iVar10 = TBufferNewPage(tokens);
            if (iVar10 != 0) {
              iVar10 = tokens->left_;
              goto LAB_0013ae0e;
            }
          }
          else {
LAB_0013ae0e:
            tokens->left_ = iVar10 + -1;
            tokens->tokens_[(long)iVar10 + -1] =
                 (ushort)(lVar15 < (long)uVar21) << 0xf | (ushort)iVar19;
          }
          papVar17 = (proba_t (*) [11])
                     ((long)*paapVar5 + lVar22 * 0x2c + (ulong)bVar2 * 0x80 + (ulong)bVar2 * 4);
          uVar12 = (*papVar17)[0];
          uVar13 = uVar12 + 1 >> 1 & 0x7fff7fff;
          if (uVar12 < 0xfffe0000) {
            uVar13 = uVar12;
          }
          (*papVar17)[0] = uVar13 + 0x10000 + (uint)(lVar15 < (long)uVar21);
          if ((long)uVar21 <= lVar15) break;
        }
        lVar15 = lVar1;
      } while (lVar1 != 0x10);
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

int VP8RecordCoeffTokens(int ctx, const struct VP8Residual* const res,
                         VP8TBuffer* const tokens) {
  const int16_t* const coeffs = res->coeffs;
  const int coeff_type = res->coeff_type;
  const int last = res->last;
  int n = res->first;
  uint32_t base_id = TOKEN_ID(coeff_type, n, ctx);
  // should be stats[VP8EncBands[n]], but it's equivalent for n=0 or 1
  proba_t* s = res->stats[n][ctx];
  if (!AddToken(tokens, last >= 0, base_id + 0, s + 0)) {
    return 0;
  }

  while (n < 16) {
    const int c = coeffs[n++];
    const int sign = c < 0;
    const uint32_t v = sign ? -c : c;
    if (!AddToken(tokens, v != 0, base_id + 1, s + 1)) {
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 0);  // ctx=0
      s = res->stats[VP8EncBands[n]][0];
      continue;
    }
    if (!AddToken(tokens, v > 1, base_id + 2, s + 2)) {
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 1);  // ctx=1
      s = res->stats[VP8EncBands[n]][1];
    } else {
      if (!AddToken(tokens, v > 4, base_id + 3, s + 3)) {
        if (AddToken(tokens, v != 2, base_id + 4, s + 4)) {
          AddToken(tokens, v == 4, base_id + 5, s + 5);
        }
      } else if (!AddToken(tokens, v > 10, base_id + 6, s + 6)) {
        if (!AddToken(tokens, v > 6, base_id + 7, s + 7)) {
          AddConstantToken(tokens, v == 6, 159);
        } else {
          AddConstantToken(tokens, v >= 9, 165);
          AddConstantToken(tokens, !(v & 1), 145);
        }
      } else {
        int mask;
        const uint8_t* tab;
        uint32_t residue = v - 3;
        if (residue < (8 << 1)) {          // VP8Cat3  (3b)
          AddToken(tokens, 0, base_id + 8, s + 8);
          AddToken(tokens, 0, base_id + 9, s + 9);
          residue -= (8 << 0);
          mask = 1 << 2;
          tab = VP8Cat3;
        } else if (residue < (8 << 2)) {   // VP8Cat4  (4b)
          AddToken(tokens, 0, base_id + 8, s + 8);
          AddToken(tokens, 1, base_id + 9, s + 9);
          residue -= (8 << 1);
          mask = 1 << 3;
          tab = VP8Cat4;
        } else if (residue < (8 << 3)) {   // VP8Cat5  (5b)
          AddToken(tokens, 1, base_id + 8, s + 8);
          AddToken(tokens, 0, base_id + 10, s + 9);
          residue -= (8 << 2);
          mask = 1 << 4;
          tab = VP8Cat5;
        } else {                         // VP8Cat6 (11b)
          AddToken(tokens, 1, base_id + 8, s + 8);
          AddToken(tokens, 1, base_id + 10, s + 9);
          residue -= (8 << 3);
          mask = 1 << 10;
          tab = VP8Cat6;
        }
        while (mask) {
          AddConstantToken(tokens, !!(residue & mask), *tab++);
          mask >>= 1;
        }
      }
      base_id = TOKEN_ID(coeff_type, VP8EncBands[n], 2);  // ctx=2
      s = res->stats[VP8EncBands[n]][2];
    }
    AddConstantToken(tokens, sign, 128);
    if (n == 16 || !AddToken(tokens, n <= last, base_id + 0, s + 0)) {
      return 1;   // EOB
    }
  }
  return 1;
}